

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

int cdef_filter_block_worker_hook(void *arg1,void *arg2)

{
  int iVar1;
  undefined8 *in_RSI;
  long *in_RDI;
  int sb_count;
  int cur_fbc;
  int cur_fbr;
  CdefSearchCtx *cdef_search_ctx;
  aom_internal_error_info *error_info;
  pthread_mutex_t *cdef_mutex_;
  AV1CdefSync *cdef_sync;
  EncWorkerData *thread_data;
  int in_stack_0000af8c;
  int in_stack_0000af90;
  int in_stack_0000af94;
  aom_internal_error_info *in_stack_0000af98;
  CdefSearchCtx *in_stack_0000afa0;
  int *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  int *cur_fbr_00;
  CdefSearchCtx *cdef_search_ctx_00;
  pthread_mutex_t *__mutex;
  int local_4;
  
  __mutex = (pthread_mutex_t *)*in_RSI;
  cdef_search_ctx_00 = (CdefSearchCtx *)(in_RDI + 3);
  cur_fbr_00 = *(int **)(*in_RDI + 0x42c28);
  iVar1 = _setjmp((__jmp_buf_tag *)(in_RDI + 0x1e));
  if (iVar1 == 0) {
    *(undefined4 *)(cdef_search_ctx_00->plane[0].seg_iqmatrix[0] + 2) = 1;
    while( true ) {
      iVar1 = cdef_get_next_job((AV1CdefSync *)&__mutex->__data,cdef_search_ctx_00,cur_fbr_00,
                                in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      if (iVar1 == 0) break;
      av1_cdef_mse_calc_block
                (in_stack_0000afa0,in_stack_0000af98,in_stack_0000af94,in_stack_0000af90,
                 in_stack_0000af8c);
    }
    *(undefined4 *)(cdef_search_ctx_00->plane[0].seg_iqmatrix[0] + 2) = 0;
    local_4 = 1;
  }
  else {
    *(undefined4 *)(cdef_search_ctx_00->plane[0].seg_iqmatrix[0] + 2) = 0;
    pthread_mutex_lock(__mutex);
    *(undefined1 *)((long)in_RSI + 0x1c) = 1;
    pthread_mutex_unlock(__mutex);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int cdef_filter_block_worker_hook(void *arg1, void *arg2) {
  EncWorkerData *thread_data = (EncWorkerData *)arg1;
  AV1CdefSync *const cdef_sync = (AV1CdefSync *)arg2;

#if CONFIG_MULTITHREAD
  pthread_mutex_t *cdef_mutex_ = cdef_sync->mutex_;
#endif
  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  CdefSearchCtx *cdef_search_ctx = thread_data->cpi->cdef_search_ctx;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(cdef_mutex_);
    cdef_sync->cdef_mt_exit = true;
    pthread_mutex_unlock(cdef_mutex_);
#endif
    return 0;
  }
  error_info->setjmp = 1;

  volatile int cur_fbr, cur_fbc, sb_count;
  while (cdef_get_next_job(cdef_sync, cdef_search_ctx, &cur_fbr, &cur_fbc,
                           &sb_count)) {
    av1_cdef_mse_calc_block(cdef_search_ctx, error_info, cur_fbr, cur_fbc,
                            sb_count);
  }
  error_info->setjmp = 0;
  return 1;
}